

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O1

void __thiscall PressDelayHandler::sendMouseEvent(PressDelayHandler *this,QMouseEvent *me,int flags)

{
  undefined2 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  Data *pDVar6;
  undefined4 uVar7;
  QGraphicsView *this_00;
  QGraphicsScene *pQVar8;
  QGraphicsScene *this_01;
  QGraphicsItem *this_02;
  QWidget *pQVar9;
  undefined8 uVar10;
  QObject *receiver;
  long in_FS_OFFSET;
  qreal qVar11;
  QPointF QVar12;
  undefined8 local_d8;
  qreal local_d0;
  QPointF local_c8;
  qreal local_b8;
  qreal local_b0;
  QPointF local_a8;
  qreal local_98;
  qreal local_90;
  QMouseEvent copy;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar6 = (this->mouseTarget).wp.d;
  if (((pDVar6 == (Data *)0x0) || (*(int *)(pDVar6 + 4) == 0)) ||
     ((this->mouseTarget).wp.value == (QObject *)0x0)) goto LAB_00660a4a;
  this->sendingEvent = true;
  if (*(long *)(*(long *)((this->mouseTarget).wp.value + 8) + 0x10) == 0) {
LAB_00660898:
    this_02 = (QGraphicsItem *)0x0;
  }
  else {
    this_00 = (QGraphicsView *)QMetaObject::cast((QObject *)&QGraphicsView::staticMetaObject);
    if (this_00 == (QGraphicsView *)0x0) goto LAB_00660898;
    pQVar8 = QGraphicsView::scene(this_00);
    if (pQVar8 == (QGraphicsScene *)0x0) goto LAB_00660898;
    this_01 = (QGraphicsScene *)QGraphicsView::scene(this_00);
    this_02 = QGraphicsScene::mouseGrabberItem(this_01);
  }
  if (((flags & 1U) != 0) && (this_02 != (QGraphicsItem *)0x0)) {
    QGraphicsItem::ungrabMouse(this_02);
  }
  if (me != (QMouseEvent *)0x0) {
    _copy = &DAT_aaaaaaaaaaaaaaaa;
    uVar1 = *(undefined2 *)(me + 8);
    pDVar6 = (this->mouseTarget).wp.d;
    if ((pDVar6 == (Data *)0x0) || (*(int *)(pDVar6 + 4) == 0)) {
      pQVar9 = (QWidget *)0x0;
    }
    else {
      pQVar9 = (QWidget *)(this->mouseTarget).wp.value;
    }
    local_a8.xp = (qreal)QEventPoint::globalPosition();
    QVar12 = QWidget::mapFromGlobal(pQVar9,&local_a8);
    qVar11 = QVar12.yp;
    local_98 = QVar12.xp;
    local_90 = qVar11;
    pQVar9 = QWidget::window((QWidget *)(this->mouseTarget).wp.value);
    local_c8.xp = (qreal)QEventPoint::globalPosition();
    local_c8.yp = qVar11;
    QVar12 = QWidget::mapFromGlobal(pQVar9,&local_c8);
    qVar11 = QVar12.yp;
    local_b8 = QVar12.xp;
    local_b0 = qVar11;
    local_d8 = QEventPoint::globalPosition();
    uVar2 = *(undefined4 *)(me + 0x20);
    uVar3 = *(undefined4 *)(me + 0x40);
    uVar4 = *(undefined4 *)(me + 0x44);
    local_d0 = qVar11;
    uVar7 = QMouseEvent::source();
    uVar10 = QPointerEvent::pointingDevice();
    QMouseEvent::QMouseEvent
              (&copy,uVar1,&local_98,&local_b8,&local_d8,uVar3,uVar4,uVar2,uVar7,uVar10);
    QPointerEvent::setTimestamp((ulonglong)&copy);
    pDVar6 = (this->mouseTarget).wp.d;
    if (pDVar6 == (Data *)0x0) {
      receiver = (QObject *)0x0;
    }
    else if (*(int *)(pDVar6 + 4) == 0) {
      receiver = (QObject *)0x0;
    }
    else {
      receiver = (this->mouseTarget).wp.value;
    }
    qt_sendSpontaneousEvent(receiver,(QEvent *)&copy);
    QMouseEvent::~QMouseEvent(&copy);
  }
  if (((flags & 2U) != 0) && (this_02 != (QGraphicsItem *)0x0)) {
    QGraphicsItem::grabMouse(this_02);
  }
  this->sendingEvent = false;
LAB_00660a4a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void sendMouseEvent(QMouseEvent *me, int flags = 0)
    {
        if (mouseTarget) {
            sendingEvent = true;

#if QT_CONFIG(graphicsview)
            QGraphicsItem *grabber = nullptr;
            if (mouseTarget->parentWidget()) {
                if (QGraphicsView *gv = qobject_cast<QGraphicsView *>(mouseTarget->parentWidget())) {
                    if (gv->scene())
                        grabber = gv->scene()->mouseGrabberItem();
                }
            }

            if (grabber && (flags & UngrabMouseBefore)) {
                // GraphicsView Mouse Handling Workaround #1:
                // we need to ungrab the mouse before re-sending the press,
                // since the scene had already set the mouse grabber to the
                // original (and consumed) event's receiver
                qFGDebug() << "QFG: ungrabbing" << grabber;
                grabber->ungrabMouse();
            }
#else
            Q_UNUSED(flags);
#endif // QT_CONFIG(graphicsview)

            if (me) {
                QMouseEvent copy(me->type(), mouseTarget->mapFromGlobal(me->globalPosition()),
                                 mouseTarget->topLevelWidget()->mapFromGlobal(me->globalPosition()), me->globalPosition(),
                                 me->button(), me->buttons(), me->modifiers(),
                                 me->source(), me->pointingDevice());
                copy.setTimestamp(me->timestamp());
                qt_sendSpontaneousEvent(mouseTarget, &copy);
            }

#if QT_CONFIG(graphicsview)
            if (grabber && (flags & RegrabMouseAfterwards)) {
                // GraphicsView Mouse Handling Workaround #2:
                // we need to re-grab the mouse after sending a faked mouse
                // release, since we still need the mouse moves for the gesture
                // (the scene will clear the item's mouse grabber status on
                // release).
                qFGDebug() << "QFG: re-grabbing" << grabber;
                grabber->grabMouse();
            }
#endif
            sendingEvent = false;
        }
    }